

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

int __thiscall phosg::scoped_fd::open(scoped_fd *this,char *__file,int __oflag,...)

{
  char *__s;
  int iVar1;
  cannot_open_file *this_00;
  uint in_ECX;
  allocator<char> local_41;
  string local_40;
  uint local_20;
  int local_1c;
  mode_t perm_local;
  int mode_local;
  char *filename_local;
  scoped_fd *this_local;
  
  local_20 = in_ECX;
  local_1c = __oflag;
  _perm_local = __file;
  filename_local = (char *)this;
  close(this,(int)__file);
  iVar1 = ::open(_perm_local,local_1c,(ulong)local_20);
  this->fd = iVar1;
  if (this->fd < 0) {
    this_00 = (cannot_open_file *)__cxa_allocate_exception(0x20);
    __s = _perm_local;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
    cannot_open_file::cannot_open_file(this_00,&local_40);
    __cxa_throw(this_00,&cannot_open_file::typeinfo,cannot_open_file::~cannot_open_file);
  }
  return (int)this;
}

Assistant:

void scoped_fd::open(const char* filename, int mode, mode_t perm) {
  this->close();
  this->fd = ::open(filename, mode, perm);
  if (this->fd < 0) {
    throw cannot_open_file(filename);
  }
}